

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_3,_4> *
tcu::operator*(Matrix<float,_3,_4> *__return_storage_ptr__,Matrix<float,_3,_2> *a,
              Matrix<float,_2,_4> *b)

{
  int row;
  long lVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  Vector<float,_3> *pVVar4;
  int ndx;
  long lVar5;
  float v;
  float fVar6;
  
  Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pVVar2 = (Vector<float,_2> *)b;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar6 = 0.0;
      pVVar4 = (Vector<float,_3> *)a;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        fVar6 = fVar6 + ((Vector<tcu::Vector<float,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[0] *
                        ((Vector<tcu::Vector<float,_2>,_4> *)pVVar2->m_data)->m_data[0].m_data
                        [lVar5];
        pVVar4 = pVVar4 + 1;
      }
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = fVar6;
      pVVar2 = pVVar2 + 1;
    }
    a = (Matrix<float,_3,_2> *)(((Vector<float,_3> *)a)->m_data + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}